

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O2

int __thiscall QDialPrivate::valueFromPoint(QDialPrivate *this,QPoint *p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  double __y;
  double __x;
  double dVar7;
  
  lVar6 = *(long *)(*(long *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8 +
                   0x20);
  __y = (double)((*(int *)(lVar6 + 0x20) - *(int *)(lVar6 + 0x18)) + 1) * 0.5 - (double)(p->yp).m_i;
  __x = (double)(p->xp).m_i - (double)((*(int *)(lVar6 + 0x1c) - *(int *)(lVar6 + 0x14)) + 1) * 0.5;
  dVar7 = 0.0;
  if ((((__y != 0.0) || (NAN(__y))) || (__x != 0.0)) || (NAN(__x))) {
    dVar7 = atan2(__y,__x);
  }
  iVar3 = *(int *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254;
  iVar2 = (this->super_QAbstractSliderPrivate).maximum;
  uVar4 = -iVar3;
  if (-1 < iVar3) {
    uVar4 = 0;
  }
  iVar5 = 0;
  if (0 < iVar3) {
    iVar5 = iVar3;
  }
  lVar6 = (ulong)((this->field_0x298 & 2) == 0) * 8;
  bVar1 = (this->super_QAbstractSliderPrivate).field_0x27c;
  iVar3 = (**(code **)(*(long *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate + 0xa8))
                    (this,(int)(((*(double *)(&DAT_00659de0 + lVar6) -
                                 (double)(~-(ulong)(dVar7 < -1.5707963267948966) & (ulong)dVar7 |
                                         (ulong)(dVar7 + 6.283185307179586) &
                                         -(ulong)(dVar7 < -1.5707963267948966))) *
                                (double)(iVar2 - iVar3)) / *(double *)(&DAT_00659df0 + lVar6) +
                               (double)iVar5 + 0.5) - (iVar3 >> 0x1f & uVar4));
  if ((bVar1 & 8) != 0) {
    iVar3 = iVar2 - iVar3;
  }
  return iVar3;
}

Assistant:

int QDialPrivate::valueFromPoint(const QPoint &p) const
{
    Q_Q(const QDial);
    double yy = q->height()/2.0 - p.y();
    double xx = p.x() - q->width()/2.0;
    double a = (xx || yy) ? std::atan2(yy, xx) : 0;

    if (a < Q_PI / -2)
        a = a + Q_PI * 2;

    int dist = 0;
    int minv = minimum, maxv = maximum;

    if (minimum < 0) {
        dist = -minimum;
        minv = 0;
        maxv = maximum + dist;
    }

    int r = maxv - minv;
    int v;
    if (wrapping)
        v =  (int)(0.5 + minv + r * (Q_PI * 3 / 2 - a) / (2 * Q_PI));
    else
        v =  (int)(0.5 + minv + r* (Q_PI * 4 / 3 - a) / (Q_PI * 10 / 6));

    if (dist > 0)
        v -= dist;

    return !invertedAppearance ? bound(v) : maximum - bound(v);
}